

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O1

void __thiscall draco::TriangleSoupMeshBuilder::Start(TriangleSoupMeshBuilder *this,int num_faces)

{
  Mesh *pMVar1;
  pointer pcVar2;
  Mesh *this_00;
  value_type local_28;
  
  this_00 = (Mesh *)operator_new(0xd8);
  Mesh::Mesh(this_00);
  pMVar1 = (this->mesh_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>.
           _M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
           super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
  (this->mesh_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
  super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
  super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this_00;
  if (pMVar1 != (Mesh *)0x0) {
    (**(code **)((long)(pMVar1->super_PointCloud)._vptr_PointCloud + 8))();
  }
  local_28._M_elems[2].value_ = 0;
  local_28._M_elems[0].value_ = 0;
  local_28._M_elems[1].value_ = 0;
  std::
  vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
  ::resize(&(((this->mesh_)._M_t.
              super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
              super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
              super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl)->faces_).vector_,
           (long)num_faces,&local_28);
  (((this->mesh_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl)->super_PointCloud).num_points_ =
       num_faces * 3;
  pcVar2 = (this->attribute_element_types_).
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->attribute_element_types_).super__Vector_base<signed_char,_std::allocator<signed_char>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (this->attribute_element_types_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  return;
}

Assistant:

void TriangleSoupMeshBuilder::Start(int num_faces) {
  mesh_ = std::unique_ptr<Mesh>(new Mesh());
  mesh_->SetNumFaces(num_faces);
  mesh_->set_num_points(num_faces * 3);
  attribute_element_types_.clear();
}